

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ioReadBlifMv.c
# Opt level: O0

void Io_MvSplitIntoTokensMv(Vec_Ptr_t *vTokens,char *pLine)

{
  int iVar1;
  bool bVar2;
  char *local_20;
  char *pCur;
  char *pLine_local;
  Vec_Ptr_t *vTokens_local;
  
  local_20 = pLine;
  while( true ) {
    bVar2 = true;
    if (*local_20 == '.') {
      bVar2 = local_20[1] == 'd';
    }
    if (!bVar2) break;
    iVar1 = Io_MvCharIsSpace(*local_20);
    if (iVar1 != 0) {
      *local_20 = '\0';
    }
    local_20 = local_20 + 1;
  }
  Io_MvCollectTokens(vTokens,pLine,local_20);
  return;
}

Assistant:

static void Io_MvSplitIntoTokensMv( Vec_Ptr_t * vTokens, char * pLine )
{
    char * pCur;
    // clear spaces
    for ( pCur = pLine; *pCur != '.' || *(pCur+1) == 'd'; pCur++ )
        if ( Io_MvCharIsSpace(*pCur) )
            *pCur = 0;
    // collect tokens
    Io_MvCollectTokens( vTokens, pLine, pCur );
}